

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O2

void jinit_1pass_quantizer(j_decompress_ptr cinfo)

{
  uint uVar1;
  J_COLOR_SPACE JVar2;
  int iVar3;
  jpeg_error_mgr *pjVar4;
  bool bVar5;
  jpeg_color_quantizer *pjVar6;
  ulong uVar7;
  ulong uVar8;
  JSAMPARRAY ppJVar9;
  ulong uVar10;
  jpeg_error_mgr *pjVar11;
  int iVar12;
  ulong uVar13;
  JDIMENSION JVar14;
  bool bVar15;
  uint uVar16;
  long lVar17;
  JDIMENSION JVar18;
  ulong uVar19;
  long lVar20;
  int local_44 [3];
  j_decompress_ptr local_38;
  
  pjVar6 = (jpeg_color_quantizer *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x98);
  cinfo->cquantize = pjVar6;
  pjVar6->start_pass = start_pass_1_quant;
  pjVar6->finish_pass = finish_pass_1_quant;
  pjVar6->new_color_map = new_color_map_1_quant;
  pjVar6[3].finish_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar6[2].finish_pass = (_func_void_j_decompress_ptr *)0x0;
  if (4 < cinfo->out_color_components) {
    *(undefined8 *)&cinfo->err->msg_code = 0x400000037;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar12 = cinfo->desired_number_of_colors;
  if (0x100 < iVar12) {
    *(undefined8 *)&cinfo->err->msg_code = 0x10000000039;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    iVar12 = cinfo->desired_number_of_colors;
  }
  pjVar6 = cinfo->cquantize;
  uVar1 = cinfo->out_color_components;
  JVar2 = cinfo->out_color_space;
  local_44[0] = rgb_green[JVar2];
  local_44[1] = rgb_red[JVar2];
  local_44[2] = rgb_blue[JVar2];
  lVar20 = (long)iVar12;
  uVar10 = 1;
  do {
    uVar8 = uVar10;
    uVar10 = uVar8 + 1;
    uVar7 = uVar10;
    for (iVar12 = 1; iVar12 < (int)uVar1; iVar12 = iVar12 + 1) {
      uVar7 = uVar7 * uVar10;
    }
  } while ((long)uVar7 <= lVar20);
  if (uVar8 < 2) {
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0x38;
    (pjVar4->msg_parm).i[0] = (int)uVar7;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  uVar7 = 0;
  uVar10 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar10 = uVar7;
  }
  uVar19 = 1;
  for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    *(int *)((long)&pjVar6[1].new_color_map + uVar7 * 4 + 4) = (int)uVar8;
    uVar19 = (ulong)(uint)((int)uVar19 * (int)uVar8);
  }
  uVar7 = 0;
  bVar5 = true;
LAB_001234da:
  do {
    bVar15 = bVar5;
    JVar18 = (JDIMENSION)uVar19;
    if (uVar7 != uVar10) {
      iVar12 = (int)uVar7;
      if (cinfo->out_color_space == JCS_RGB) {
        iVar12 = local_44[uVar7];
      }
      iVar3 = *(int *)((long)&pjVar6[1].new_color_map + (long)iVar12 * 4 + 4);
      lVar17 = (long)iVar3 + 1;
      uVar8 = ((int)JVar18 / iVar3) * lVar17;
      if (uVar8 - lVar20 == 0 || (long)uVar8 < lVar20) {
        *(int *)((long)&pjVar6[1].new_color_map + (long)iVar12 * 4 + 4) = (int)lVar17;
        uVar7 = uVar7 + 1;
        uVar19 = uVar8 & 0xffffffff;
        bVar5 = false;
        goto LAB_001234da;
      }
    }
    uVar7 = 0;
    bVar5 = true;
    if (bVar15) {
      iVar12 = cinfo->out_color_components;
      pjVar4 = cinfo->err;
      (pjVar4->msg_parm).i[0] = JVar18;
      if (iVar12 == 3) {
        (pjVar4->msg_parm).i[1] = *(int *)((long)&pjVar6[1].new_color_map + 4);
        (pjVar4->msg_parm).i[2] = *(int *)&pjVar6[2].start_pass;
        (pjVar4->msg_parm).i[3] = *(int *)((long)&pjVar6[2].start_pass + 4);
        iVar12 = 0x5e;
        pjVar11 = pjVar4;
      }
      else {
        pjVar11 = cinfo->err;
        iVar12 = 0x5f;
      }
      pjVar4->msg_code = iVar12;
      (*pjVar11->emit_message)((j_common_ptr)cinfo,1);
      ppJVar9 = (*cinfo->mem->alloc_sarray)
                          ((j_common_ptr)cinfo,1,JVar18,cinfo->out_color_components);
      JVar14 = JVar18;
      for (lVar20 = 0; lVar20 < cinfo->out_color_components; lVar20 = lVar20 + 1) {
        uVar1 = *(uint *)((long)&pjVar6[1].new_color_map + lVar20 * 4 + 4);
        uVar16 = (int)JVar14 / (int)uVar1;
        uVar10 = (long)(int)uVar1 - 1;
        uVar7 = 0;
        uVar8 = 0;
        if (0 < (int)uVar16) {
          uVar8 = (ulong)uVar16;
        }
        uVar19 = 0;
        if (0 < (int)uVar1) {
          uVar19 = (ulong)uVar1;
        }
        iVar12 = 0;
        for (; uVar7 != uVar19; uVar7 = uVar7 + 1) {
          for (lVar17 = (long)iVar12; lVar17 < (int)JVar18; lVar17 = lVar17 + (int)JVar14) {
            for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
              ppJVar9[lVar20][uVar13 + lVar17] =
                   (JSAMPLE)((long)(uVar7 * 0xff +
                                   (long)(int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                                     uVar10 & 0xffffffff) / 2)) / (long)uVar10);
            }
          }
          iVar12 = iVar12 + uVar16;
        }
        JVar14 = uVar16;
      }
      pjVar6[1].start_pass = (_func_void_j_decompress_ptr_boolean *)ppJVar9;
      *(JDIMENSION *)&pjVar6[1].color_quantize = JVar18;
      local_38 = cinfo;
      create_colorindex(cinfo);
      if (cinfo->dither_mode == JDITHER_FS) {
        alloc_fs_workspace(cinfo);
        return;
      }
      return;
    }
  } while( true );
}

Assistant:

GLOBAL(void)
jinit_1pass_quantizer(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize;

  cquantize = (my_cquantize_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_cquantizer));
  cinfo->cquantize = (struct jpeg_color_quantizer *)cquantize;
  cquantize->pub.start_pass = start_pass_1_quant;
  cquantize->pub.finish_pass = finish_pass_1_quant;
  cquantize->pub.new_color_map = new_color_map_1_quant;
  cquantize->fserrors[0] = NULL; /* Flag FS workspace not allocated */
  cquantize->odither[0] = NULL; /* Also flag odither arrays not allocated */

  /* Make sure my internal arrays won't overflow */
  if (cinfo->out_color_components > MAX_Q_COMPS)
    ERREXIT1(cinfo, JERR_QUANT_COMPONENTS, MAX_Q_COMPS);
  /* Make sure colormap indexes can be represented by JSAMPLEs */
  if (cinfo->desired_number_of_colors > (MAXJSAMPLE + 1))
    ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, MAXJSAMPLE + 1);

  /* Create the colormap and color index table. */
  create_colormap(cinfo);
  create_colorindex(cinfo);

  /* Allocate Floyd-Steinberg workspace now if requested.
   * We do this now since it may affect the memory manager's space
   * calculations.  If the user changes to FS dither mode in a later pass, we
   * will allocate the space then, and will possibly overrun the
   * max_memory_to_use setting.
   */
  if (cinfo->dither_mode == JDITHER_FS)
    alloc_fs_workspace(cinfo);
}